

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

GLuint gl4cts::GLSL420Pack::Utils::getNumberOfCoordinates(TEXTURE_TYPES type)

{
  TestError *this;
  GLuint local_10;
  GLuint result;
  TEXTURE_TYPES type_local;
  
  switch(type) {
  case TEX_BUFFER:
    local_10 = 1;
    break;
  case TEX_2D:
    local_10 = 2;
    break;
  case TEX_2D_RECT:
    local_10 = 2;
    break;
  case TEX_2D_ARRAY:
    local_10 = 3;
    break;
  case TEX_3D:
    local_10 = 3;
    break;
  case TEX_CUBE:
    local_10 = 3;
    break;
  case TEX_1D:
    local_10 = 1;
    break;
  case TEX_1D_ARRAY:
    local_10 = 2;
    break;
  default:
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x1ac);
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return local_10;
}

Assistant:

GLuint Utils::getNumberOfCoordinates(Utils::TEXTURE_TYPES type)
{
	GLuint result = 0;

	switch (type)
	{
	case TEX_BUFFER:
		result = 1;
		break;
	case TEX_2D:
		result = 2;
		break;
	case TEX_2D_RECT:
		result = 2;
		break;
	case TEX_2D_ARRAY:
		result = 3;
		break;
	case TEX_3D:
		result = 3;
		break;
	case TEX_CUBE:
		result = 3;
		break;
	case TEX_1D:
		result = 1;
		break;
	case TEX_1D_ARRAY:
		result = 2;
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	return result;
}